

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_sequenceTuple_create(sysbvm_context_t *context,sysbvm_tuple_t sequenceTupleType)

{
  ulong uVar1;
  sysbvm_object_tuple_t *psVar2;
  size_t slotCount;
  
  if (sequenceTupleType == 0 || (sequenceTupleType & 0xf) != 0) {
    sysbvm_error_nullArgument();
  }
  uVar1 = *(ulong *)(sequenceTupleType + 0x58);
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    slotCount = (long)uVar1 >> 4;
  }
  else {
    slotCount = *(size_t *)(uVar1 + 0x10);
  }
  if ((slotCount != 0) ||
     (psVar2 = *(sysbvm_object_tuple_t **)(sequenceTupleType + 0x78),
     psVar2 == (sysbvm_object_tuple_t *)0x0)) {
    psVar2 = sysbvm_context_allocatePointerTuple(context,sequenceTupleType,slotCount);
    if (slotCount == 0) {
      *(sysbvm_object_tuple_t **)(sequenceTupleType + 0x78) = psVar2;
    }
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sequenceTuple_create(sysbvm_context_t *context, sysbvm_tuple_t sequenceTupleType)
{
    if(!sysbvm_tuple_isNonNullPointer(sequenceTupleType)) sysbvm_error_nullArgument();

    sysbvm_sequenceTupleType_t* sequenceTupleTypeObject = (sysbvm_sequenceTupleType_t*)sequenceTupleType;
    size_t slotCount = sysbvm_tuple_size_decode(sequenceTupleTypeObject->super.totalSlotCount);
    if(slotCount == 0 && sequenceTupleTypeObject->super.emptyTrivialSingleton)
        return sequenceTupleTypeObject->super.emptyTrivialSingleton;

    sysbvm_tuple_t result = (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, sequenceTupleType, slotCount);
    if(slotCount == 0)
        sequenceTupleTypeObject->super.emptyTrivialSingleton = result;
    return result;
}